

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

char * gl4cts::anon_unknown_0::GetInputC1
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data)

{
  float *pfVar1;
  float *fp;
  int i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data_local;
  
  for (fp._4_4_ = 0; fp._4_4_ < 4; fp._4_4_ = fp._4_4_ + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data + fp._4_4_,4);
    pfVar1 = (float *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                (in_data + fp._4_4_,0);
    *pfVar1 = (float)(fp._4_4_ + 1) * 1.0;
  }
  return 
  "\nlayout(std430, binding = 0) buffer Input {\n  float data0;\n} g_input[4];\nlayout(std430, binding = 4) buffer Output {\n  float data0;\n} g_output[4];\nvoid main() {\n  for (int i = 0; i < 4; ++i) {\n    g_output[i].data0 = g_input[i].data0;\n  }\n}"
  ;
}

Assistant:

const char* GetInputC1(std::vector<GLubyte> in_data[4])
{
	for (int i = 0; i < 4; ++i)
	{
		in_data[i].resize(1 * 4);
		float* fp = reinterpret_cast<float*>(&in_data[i][0]);
		fp[0]	 = static_cast<float>(i + 1) * 1.0f;
	}

	return NL "layout(std430, binding = 0) buffer Input {" NL "  float data0;" NL "} g_input[4];" NL
			  "layout(std430, binding = 4) buffer Output {" NL "  float data0;" NL "} g_output[4];" NL
			  "void main() {" NL "  for (int i = 0; i < 4; ++i) {" NL "    g_output[i].data0 = g_input[i].data0;" NL
			  "  }" NL "}";
}